

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O3

int Gia_ManAreDeriveNexts(Gia_ManAre_t *p,Gia_PtrAre_t Sta)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  undefined8 uVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Gia_Man_t *pGVar11;
  Gia_Obj_t *pGVar12;
  uint *puVar13;
  uint uVar14;
  uint uVar15;
  Vec_Int_t *pVVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  timespec ts;
  timespec local_68;
  long local_58;
  long local_50;
  Gia_ManAre_t *local_48;
  size_t local_40;
  Gia_Obj_t *local_38;
  
  iVar8 = clock_gettime(3,&local_68);
  if (iVar8 < 0) {
    iVar8 = 1;
  }
  else {
    iVar8 = ((int)(SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8) >> 7) -
            (SUB164(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),0xc) >> 0x1f)) +
            (int)local_68.tv_sec * -1000000;
  }
  local_50 = *(long *)((long)p->ppStas + (ulong)((uint)Sta >> 0x11 & 0x3ff8));
  local_58 = (ulong)((uint)Sta & 0xfffff) * (long)p->nSize;
  if (*(int *)(local_50 + local_58 * 4) < 0) {
    return 0;
  }
  pGVar11 = p->pNew;
  if (pGVar11 == (Gia_Man_t *)0x0) {
LAB_006d59d3:
    pGVar11 = Gia_ManStart(p->pAig->nObjs * 10);
    p->pNew = pGVar11;
    Gia_ManIncrementTravId(pGVar11);
    Gia_ManHashAlloc(p->pNew);
    pGVar11 = p->pAig;
    pGVar11->pObjs->Value = 0;
    pVVar16 = pGVar11->vCis;
    if (0 < pVVar16->nSize) {
      lVar19 = 0;
      local_48 = p;
      do {
        iVar9 = pVVar16->pArray[lVar19];
        if (((long)iVar9 < 0) || (pGVar11->nObjs <= iVar9)) goto LAB_006d5f01;
        pGVar12 = pGVar11->pObjs;
        if (pGVar12 == (Gia_Obj_t *)0x0) break;
        pGVar11 = p->pNew;
        uVar18 = pGVar11->nObjs;
        local_38 = pGVar12;
        if (uVar18 == pGVar11->nObjsAlloc) {
          uVar15 = uVar18 * 2;
          if (0x1fffffff < (int)(uVar18 * 2)) {
            uVar15 = 0x20000000;
          }
          if (uVar18 == 0x20000000) {
            puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
            exit(1);
          }
          if ((int)uVar15 <= (int)uVar18) {
            __assert_fail("p->nObjs < nObjNew",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x25f,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
          }
          if (pGVar11->fVerbose != 0) {
            printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar18,(ulong)uVar15);
            uVar18 = pGVar11->nObjsAlloc;
          }
          if ((int)uVar18 < 1) {
            __assert_fail("p->nObjsAlloc > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x262,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
          }
          lVar20 = (long)(int)uVar15;
          local_40 = lVar20 * 4;
          if (pGVar11->pObjs == (Gia_Obj_t *)0x0) {
            pGVar12 = (Gia_Obj_t *)malloc(lVar20 * 0xc);
          }
          else {
            pGVar12 = (Gia_Obj_t *)realloc(pGVar11->pObjs,lVar20 * 0xc);
            uVar18 = pGVar11->nObjsAlloc;
          }
          pGVar11->pObjs = pGVar12;
          memset(pGVar12 + (int)uVar18,0,(long)(int)(uVar15 - uVar18) * 0xc);
          if (pGVar11->pMuxes != (uint *)0x0) {
            puVar13 = (uint *)realloc(pGVar11->pMuxes,local_40);
            pGVar11->pMuxes = puVar13;
            memset(puVar13 + pGVar11->nObjsAlloc,0,(lVar20 - pGVar11->nObjsAlloc) * 4);
          }
          pGVar11->nObjsAlloc = uVar15;
          uVar18 = pGVar11->nObjs;
          p = local_48;
        }
        pGVar11->nObjs = uVar18 + 1;
        if ((int)uVar18 < 0) goto LAB_006d5f01;
        pGVar12 = pGVar11->pObjs + uVar18;
        uVar3 = *(ulong *)pGVar12;
        *(ulong *)pGVar12 = uVar3 | 0x9fffffff;
        *(ulong *)pGVar12 =
             uVar3 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(pGVar11->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = pGVar11->pObjs;
        if ((pGVar12 < pGVar4) || (pGVar4 + pGVar11->nObjs <= pGVar12)) {
LAB_006d5f20:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(pGVar11->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = pGVar11->pObjs;
        if ((pGVar12 < pGVar4) || (pGVar4 + pGVar11->nObjs <= pGVar12)) goto LAB_006d5f20;
        local_38[iVar9].Value = (int)((ulong)((long)pGVar12 - (long)pGVar4) >> 2) * 0x55555556;
        lVar19 = lVar19 + 1;
        pGVar11 = p->pAig;
        pVVar16 = pGVar11->vCis;
      } while (lVar19 < pVVar16->nSize);
    }
  }
  else {
    if (1000000 < pGVar11->nObjs) {
      Gia_ManStop(pGVar11);
      p->pNew = (Gia_Man_t *)0x0;
      goto LAB_006d59d3;
    }
    pGVar11 = p->pAig;
  }
  iVar9 = pGVar11->nRegs;
  if ((long)iVar9 < 1) {
    iVar10 = pGVar11->nObjs;
    if (iVar10 < 1) goto LAB_006d5de5;
  }
  else {
    pVVar16 = pGVar11->vCis;
    iVar1 = pVVar16->nSize;
    uVar18 = iVar1 - iVar9;
    lVar19 = 0;
    do {
      if (((int)uVar18 < 0) || (iVar1 <= (int)uVar18)) {
LAB_006d5f5e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = pVVar16->pArray[uVar18];
      if (((long)iVar2 < 0) || (iVar10 = pGVar11->nObjs, iVar10 <= iVar2)) goto LAB_006d5f01;
      if (pGVar11->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar12 = pGVar11->pObjs + iVar2;
      uVar15 = *(uint *)(local_50 + local_58 * 4 + 8 + (long)((int)(uint)lVar19 >> 5) * 4);
      uVar14 = (uint)lVar19 & 0x1e;
      uVar17 = 0;
      if (((uVar15 >> uVar14 & 1) == 0) && (uVar17 = 1, (uVar15 >> (sbyte)uVar14 & 2) == 0)) {
        uVar5 = *(undefined8 *)pGVar12;
        if (-1 < (int)uVar5) {
          __assert_fail("pObj->fTerm",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b8,"int Gia_ObjCioId(Gia_Obj_t *)");
        }
        uVar15 = (uint)((ulong)uVar5 >> 0x20);
        pVVar6 = p->pNew->vCis;
        if (pVVar6->nSize <= (int)(uVar15 & 0x1fffffff)) goto LAB_006d5f5e;
        iVar2 = pVVar6->pArray[uVar15 & 0x1fffffff];
        if ((iVar2 < 0) || (p->pNew->nObjs <= iVar2)) goto LAB_006d5f01;
        uVar17 = iVar2 * 2;
      }
      pGVar12->Value = uVar17;
      lVar19 = lVar19 + 2;
      uVar18 = uVar18 + 1;
    } while ((long)iVar9 * 2 != lVar19);
  }
  pGVar12 = pGVar11->pObjs;
  if (pGVar12 != (Gia_Obj_t *)0x0) {
    lVar19 = 0;
    do {
      uVar3 = *(ulong *)pGVar12;
      if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar3) {
        if ((int)pGVar12[-(uVar3 & 0x1fffffff)].Value < 0) goto LAB_006d5f3f;
        uVar18 = (uint)(uVar3 >> 0x20);
        if ((int)pGVar12[-(ulong)(uVar18 & 0x1fffffff)].Value < 0) goto LAB_006d5f3f;
        uVar18 = Gia_ManHashAnd(p->pNew,pGVar12[-(uVar3 & 0x1fffffff)].Value ^
                                        (uint)(uVar3 >> 0x1d) & 1,
                                pGVar12[-(ulong)(uVar18 & 0x1fffffff)].Value ^ uVar18 >> 0x1d & 1);
        pGVar12->Value = uVar18;
        pGVar11 = p->pAig;
      }
      lVar19 = lVar19 + 1;
      iVar10 = pGVar11->nObjs;
    } while ((lVar19 < iVar10) &&
            (pGVar12 = pGVar11->pObjs + lVar19, pGVar11->pObjs != (Gia_Obj_t *)0x0));
  }
LAB_006d5de5:
  lVar19 = (long)pGVar11->vCos->nSize;
  if (0 < lVar19) {
    piVar7 = pGVar11->vCos->pArray;
    lVar20 = 0;
    do {
      iVar9 = piVar7[lVar20];
      if (((long)iVar9 < 0) || (iVar10 <= iVar9)) {
LAB_006d5f01:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar11->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar12 = pGVar11->pObjs + iVar9;
      if ((int)pGVar12[-(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff)].Value < 0) {
LAB_006d5f3f:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
      pGVar12->Value =
           (uint)*(undefined8 *)pGVar12 >> 0x1d & 1 ^
           pGVar12[-(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff)].Value;
      lVar20 = lVar20 + 1;
    } while (lVar19 != lVar20);
  }
  p->nRecCalls = 0;
  iVar9 = Gia_ManAreDeriveNexts_rec(p,Sta);
  if (999999 < p->nRecCalls) {
    printf("Exceeded the limit on the number of transitions from a state cube (%d).\n",1000000);
    p->fStopped = 1;
  }
  iVar10 = clock_gettime(3,&local_68);
  if (iVar10 < 0) {
    iVar10 = -1;
  }
  else {
    iVar10 = (int)(local_68.tv_nsec / 1000) + (int)local_68.tv_sec * 1000000;
  }
  p->timeAig = p->timeAig + iVar10 + iVar8;
  return iVar9;
}

Assistant:

int Gia_ManAreDeriveNexts( Gia_ManAre_t * p, Gia_PtrAre_t Sta )
{
    Gia_StaAre_t * pSta;
    Gia_Obj_t * pObj;
    int i, RetValue;
    abctime clk = Abc_Clock();
    pSta = Gia_ManAreSta( p, Sta );
    if ( Gia_StaIsUnused(pSta) )
        return 0;
    // recycle the manager
    if ( p->pNew && Gia_ManObjNum(p->pNew) > 1000000 )
    {
        Gia_ManStop( p->pNew );
        p->pNew = NULL;
    }
    // allocate the manager
    if ( p->pNew == NULL )
    {
        p->pNew = Gia_ManStart( 10 * Gia_ManObjNum(p->pAig) );
        Gia_ManIncrementTravId( p->pNew );
        Gia_ManHashAlloc( p->pNew );
        Gia_ManConst0(p->pAig)->Value = 0;
        Gia_ManForEachCi( p->pAig, pObj, i )
            pObj->Value = Gia_ManAppendCi(p->pNew);
    }
    Gia_ManForEachRo( p->pAig, pObj, i )
    {
        if ( Gia_StaHasValue0( pSta, i ) )
            pObj->Value = 0;
        else if ( Gia_StaHasValue1( pSta, i ) )
            pObj->Value = 1;
        else // don't-care literal
            pObj->Value = Abc_Var2Lit( Gia_ObjId( p->pNew, Gia_ManCi(p->pNew, Gia_ObjCioId(pObj)) ), 0 );
    }
    Gia_ManForEachAnd( p->pAig, pObj, i )
        pObj->Value = Gia_ManHashAnd( p->pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p->pAig, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);

    // perform case-splitting
    p->nRecCalls = 0;
    RetValue = Gia_ManAreDeriveNexts_rec( p, Sta );
    if ( p->nRecCalls >= MAX_CALL_NUM )
    {
        printf( "Exceeded the limit on the number of transitions from a state cube (%d).\n", MAX_CALL_NUM );
        p->fStopped = 1;
    }
//    printf( "%d ", p->nRecCalls );
//printf( "%d ", Gia_ManObjNum(p->pNew) );
    p->timeAig += Abc_Clock() - clk;
    return RetValue;
}